

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair1_poly.c
# Opt level: O0

void pair1poly_pipe_get_cb(void *arg)

{
  nng_err nVar1;
  nni_msg *m;
  nni_msg *msg;
  pair1poly_pipe *p;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x3a8));
  if (nVar1 == NNG_OK) {
    m = nni_aio_get_msg((nni_aio *)((long)arg + 0x3a8));
    nni_aio_set_msg((nni_aio *)((long)arg + 0x3a8),(nni_msg *)0x0);
    nni_msg_header_clear(m);
    nni_msg_header_append_u32(m,1);
    nni_aio_set_msg((nni_aio *)((long)arg + 0x18),m);
    nni_pipe_send(*arg,(nni_aio *)((long)arg + 0x18));
  }
  else {
    nni_pipe_close(*arg);
  }
  return;
}

Assistant:

static void
pair1poly_pipe_get_cb(void *arg)
{
	pair1poly_pipe *p = arg;
	nni_msg        *msg;

	if (nni_aio_result(&p->aio_get) != 0) {
		nni_pipe_close(p->pipe);
		return;
	}

	msg = nni_aio_get_msg(&p->aio_get);
	nni_aio_set_msg(&p->aio_get, NULL);

	// Cooked mode messages have no header, so we have to add one.
	// Strip off any previously existing header, such as when
	// replying to a message.
	nni_msg_header_clear(msg);

	// Insert the hop count header.
	nni_msg_header_append_u32(msg, 1);

	nni_aio_set_msg(&p->aio_send, msg);
	nni_pipe_send(p->pipe, &p->aio_send);
}